

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

ALboolean alIsExtensionPresent(ALchar *extname)

{
  ALboolean b;
  int iVar1;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsExtensionPresent);
  IO_STRING(extname);
  iVar1 = strcasecmp(extname,"AL_EXT_trace_info");
  if (iVar1 == 0) {
    b = '\x01';
  }
  else {
    b = (*REAL_alIsExtensionPresent)(extname);
  }
  IO_BOOLEAN(b);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return b;
}

Assistant:

ALboolean alIsExtensionPresent(const ALchar *extname)
{
    ALboolean retval;
    IO_START(alIsExtensionPresent);
    IO_STRING(extname);
    if (strcasecmp(extname, "AL_EXT_trace_info") == 0) {
        retval = AL_TRUE;
    } else {
        retval = REAL_alIsExtensionPresent(extname);
    }
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}